

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void fekete_subrule_4(int suborder_num,double *suborder_xyz,double *suborder_w)

{
  int local_24;
  int s;
  double *suborder_w_local;
  double *suborder_xyz_local;
  int suborder_num_local;
  
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_xyz[local_24 * 3] = fekete_subrule_4::suborder_xy_rule_4[local_24 * 3];
    suborder_xyz[local_24 * 3 + 1] = fekete_subrule_4::suborder_xy_rule_4[local_24 * 3 + 1];
    suborder_xyz[local_24 * 3 + 2] = fekete_subrule_4::suborder_xy_rule_4[local_24 * 3 + 2];
  }
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_w[local_24] = fekete_subrule_4::suborder_w_rule_4[local_24];
  }
  return;
}

Assistant:

void fekete_subrule_4 ( int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE_4 returns a compressed Fekete rule 4.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 December 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;
  static double suborder_xy_rule_4[3*19] = {
      0.3333333333,  0.3333333333, 0.3333333334, 
      0.1988883477,  0.4005558262, 0.4005558261, 
      0.2618405201,  0.2618405201, 0.4763189598, 
      0.0807386775,  0.0807386775, 0.8385226450, 
      0.0336975736,  0.0336975736, 0.9326048528, 
      0.0000000000,  0.5000000000, 0.5000000000, 
      0.0000000000,  0.0000000000, 1.0000000000, 
      0.1089969290,  0.3837518758, 0.5072511952, 
      0.1590834479,  0.2454317980, 0.5954847541, 
      0.0887037176,  0.1697134458, 0.7415828366, 
      0.0302317829,  0.4071849276, 0.5625832895, 
      0.0748751152,  0.2874821712, 0.6376427136, 
      0.0250122615,  0.2489279690, 0.7260597695, 
      0.0262645218,  0.1206826354, 0.8530528428, 
      0.0000000000,  0.3753565349, 0.6246434651, 
      0.0000000000,  0.2585450895, 0.7414549105, 
      0.0000000000,  0.1569057655, 0.8430942345, 
      0.0000000000,  0.0768262177, 0.9231737823, 
      0.0000000000,  0.0233450767, 0.9766549233 }; 
  static double suborder_w_rule_4[19] = {
      0.0626245179, 
      0.0571359417, 
      0.0545982307, 
      0.0172630326, 
      0.0142519606, 
      0.0030868485, 
      0.0004270742, 
      0.0455876390, 
      0.0496701966, 
      0.0387998322, 
      0.0335323983, 
      0.0268431561, 
      0.0237377452, 
      0.0177255972, 
      0.0043097313, 
      0.0028258057, 
      0.0030994935, 
      0.0023829062, 
      0.0009998683 };

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_xyz[0+s*3] = suborder_xy_rule_4[0+s*3];
    suborder_xyz[1+s*3] = suborder_xy_rule_4[1+s*3];
    suborder_xyz[2+s*3] = suborder_xy_rule_4[2+s*3];
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = suborder_w_rule_4[s];
  }

  return;
}